

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

int neverbleed_init(neverbleed_t *nb,char *errbuf)

{
  int aiVar1 [2];
  int iVar2;
  __pid_t _Var3;
  undefined8 uVar4;
  RSA_METHOD *rsa_meth;
  undefined8 uVar5;
  int *piVar6;
  char *pcVar7;
  ENGINE *pEVar8;
  RSA_METHOD *rsa_method;
  EC_KEY_METHOD *ecdsa_default_method;
  EC_KEY_METHOD *ecdsa_method;
  RSA_METHOD *default_method;
  char *tempdir;
  int iStack_28;
  int listen_fd;
  int pipe_fds [2];
  char *errbuf_local;
  neverbleed_t *nb_local;
  
  _iStack_28 = 0xffffffffffffffff;
  tempdir._4_4_ = -1;
  default_method = (RSA_METHOD *)0x0;
  pipe_fds = (int  [2])errbuf;
  uVar4 = RSA_PKCS1_OpenSSL();
  rsa_meth = (RSA_METHOD *)RSA_meth_new("privsep RSA method",0);
  RSA_meth_set_priv_enc(rsa_meth,priv_enc_proxy);
  RSA_meth_set_priv_dec(rsa_meth,priv_dec_proxy);
  RSA_meth_set_sign(rsa_meth,sign_proxy);
  uVar5 = RSA_meth_get_pub_enc(uVar4);
  RSA_meth_set_pub_enc(rsa_meth,uVar5);
  uVar5 = RSA_meth_get_pub_dec(uVar4);
  RSA_meth_set_pub_dec(rsa_meth,uVar5);
  uVar4 = RSA_meth_get_verify(uVar4);
  RSA_meth_set_verify(rsa_meth,uVar4);
  RSA_meth_set_finish(rsa_meth,priv_rsa_finish);
  uVar4 = EC_KEY_get_default_method();
  uVar4 = EC_KEY_METHOD_new(uVar4);
  EC_KEY_METHOD_set_keygen(uVar4,0);
  EC_KEY_METHOD_set_compute_key(uVar4,0);
  EC_KEY_METHOD_set_sign(uVar4,ecdsa_sign_proxy,0);
  EC_KEY_METHOD_set_init(uVar4,0,priv_ecdsa_finish,0,0,0,0);
  iVar2 = pipe(&iStack_28);
  aiVar1 = pipe_fds;
  if (iVar2 == 0) {
    set_cloexec(listen_fd);
    default_method = (RSA_METHOD *)strdup("/tmp/openssl-privsep.XXXXXX");
    if (default_method == (RSA_METHOD *)0x0) {
      snprintf((char *)pipe_fds,0x100,"no memory");
    }
    else {
      pcVar7 = mkdtemp((char *)default_method);
      aiVar1 = pipe_fds;
      if (pcVar7 == (char *)0x0) {
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        snprintf((char *)aiVar1,0x100,"failed to create temporary directory under /tmp:%s",pcVar7);
      }
      else {
        memset(&nb->sun_,0,0x6e);
        (nb->sun_).sun_family = 1;
        snprintf((nb->sun_).sun_path,0x6c,"%s/_",default_method);
        RAND_bytes(nb->auth_token,0x20);
        tempdir._4_4_ = socket(1,1,0);
        aiVar1 = pipe_fds;
        if (tempdir._4_4_ == -1) {
          piVar6 = __errno_location();
          pcVar7 = strerror(*piVar6);
          snprintf((char *)aiVar1,0x100,"socket(2) failed:%s",pcVar7);
        }
        else {
          iVar2 = bind(tempdir._4_4_,(sockaddr *)&nb->sun_,0x6e);
          aiVar1 = pipe_fds;
          if (iVar2 == 0) {
            iVar2 = listen(tempdir._4_4_,0x1000);
            aiVar1 = pipe_fds;
            if (iVar2 == 0) {
              _Var3 = fork();
              aiVar1 = pipe_fds;
              nb->daemon_pid = _Var3;
              if (nb->daemon_pid == -1) {
                piVar6 = __errno_location();
                pcVar7 = strerror(*piVar6);
                snprintf((char *)aiVar1,0x100,"fork(2) failed:%s",pcVar7);
              }
              else {
                if (nb->daemon_pid == 0) {
                  close(listen_fd);
                  prctl(4,0,0,0);
                  daemon_vars.nb = nb;
                  daemon_main(tempdir._4_4_,iStack_28,(char *)default_method);
                }
                close(tempdir._4_4_);
                tempdir._4_4_ = -1;
                close(iStack_28);
                _iStack_28 = CONCAT44(listen_fd,0xffffffff);
                pEVar8 = ENGINE_new();
                nb->engine = (ENGINE *)pEVar8;
                if ((((pEVar8 != (ENGINE *)0x0) &&
                     (iVar2 = ENGINE_set_id((ENGINE *)nb->engine,"neverbleed"), iVar2 != 0)) &&
                    (iVar2 = ENGINE_set_name((ENGINE *)nb->engine,
                                             "privilege separation software engine"), iVar2 != 0))
                   && ((iVar2 = ENGINE_set_RSA((ENGINE *)nb->engine,rsa_meth), iVar2 != 0 &&
                       (iVar2 = ENGINE_set_EC(nb->engine,uVar4), iVar2 != 0)))) {
                  ENGINE_add((ENGINE *)nb->engine);
                  pthread_key_create(&nb->thread_key,dispose_thread_data);
                  free(default_method);
                  return 0;
                }
                snprintf((char *)pipe_fds,0x100,"failed to initialize the OpenSSL engine");
              }
            }
            else {
              piVar6 = __errno_location();
              pcVar7 = strerror(*piVar6);
              snprintf((char *)aiVar1,0x100,"listen(2) failed:%s",pcVar7);
            }
          }
          else {
            piVar6 = __errno_location();
            pcVar7 = strerror(*piVar6);
            snprintf((char *)aiVar1,0x100,"failed to bind to %s:%s",(nb->sun_).sun_path,pcVar7);
          }
        }
      }
    }
  }
  else {
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    snprintf((char *)aiVar1,0x100,"pipe(2) failed:%s",pcVar7);
  }
  if (iStack_28 != -1) {
    close(iStack_28);
  }
  if (listen_fd != -1) {
    close(listen_fd);
  }
  if (default_method != (RSA_METHOD *)0x0) {
    unlink_dir((char *)default_method);
    free(default_method);
  }
  if (tempdir._4_4_ != -1) {
    close(tempdir._4_4_);
  }
  if (nb->engine != (ENGINE *)0x0) {
    ENGINE_free((ENGINE *)nb->engine);
    nb->engine = (ENGINE *)0x0;
  }
  return -1;
}

Assistant:

int neverbleed_init(neverbleed_t *nb, char *errbuf)
{
    int pipe_fds[2] = {-1, -1}, listen_fd = -1;
    char *tempdir = NULL;
#if OPENSSL_1_1_API
    const RSA_METHOD *default_method = RSA_PKCS1_OpenSSL();
    EC_KEY_METHOD *ecdsa_method;
    const EC_KEY_METHOD *ecdsa_default_method;
    RSA_METHOD *rsa_method = RSA_meth_new("privsep RSA method", 0);

    RSA_meth_set_priv_enc(rsa_method, priv_enc_proxy);
    RSA_meth_set_priv_dec(rsa_method, priv_dec_proxy);
    RSA_meth_set_sign(rsa_method, sign_proxy);

    RSA_meth_set_pub_enc(rsa_method, RSA_meth_get_pub_enc(default_method));
    RSA_meth_set_pub_dec(rsa_method, RSA_meth_get_pub_dec(default_method));
    RSA_meth_set_verify(rsa_method, RSA_meth_get_verify(default_method));

    RSA_meth_set_finish(rsa_method, priv_rsa_finish);

    /* setup EC_KEY_METHOD for ECDSA */
    ecdsa_default_method = EC_KEY_get_default_method();
    ecdsa_method = EC_KEY_METHOD_new(ecdsa_default_method);

    EC_KEY_METHOD_set_keygen(ecdsa_method, NULL);
    EC_KEY_METHOD_set_compute_key(ecdsa_method, NULL);
    /* it seems sign_sig and sign_setup is not used in TLS ECDSA. */
    EC_KEY_METHOD_set_sign(ecdsa_method, ecdsa_sign_proxy, NULL, NULL);
    EC_KEY_METHOD_set_init(ecdsa_method, NULL, priv_ecdsa_finish, NULL, NULL, NULL, NULL);
#else
    const RSA_METHOD *default_method = RSA_PKCS1_SSLeay();
    RSA_METHOD *rsa_method = &static_rsa_method;

    rsa_method->rsa_pub_enc = default_method->rsa_pub_enc;
    rsa_method->rsa_pub_dec = default_method->rsa_pub_dec;
    rsa_method->rsa_verify = default_method->rsa_verify;
#endif

    /* setup the daemon */
    if (pipe(pipe_fds) != 0) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "pipe(2) failed:%s", strerror(errno));
        goto Fail;
    }
    set_cloexec(pipe_fds[1]);
    if ((tempdir = strdup("/tmp/openssl-privsep.XXXXXX")) == NULL) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "no memory");
        goto Fail;
    }
    if (mkdtemp(tempdir) == NULL) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "failed to create temporary directory under /tmp:%s", strerror(errno));
        goto Fail;
    }
    memset(&nb->sun_, 0, sizeof(nb->sun_));
    nb->sun_.sun_family = AF_UNIX;
    snprintf(nb->sun_.sun_path, sizeof(nb->sun_.sun_path), "%s/_", tempdir);
    RAND_bytes(nb->auth_token, sizeof(nb->auth_token));
    if ((listen_fd = socket(PF_UNIX, SOCK_STREAM, 0)) == -1) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "socket(2) failed:%s", strerror(errno));
        goto Fail;
    }
    if (bind(listen_fd, (void *)&nb->sun_, sizeof(nb->sun_)) != 0) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "failed to bind to %s:%s", nb->sun_.sun_path, strerror(errno));
        goto Fail;
    }
    if (listen(listen_fd, SOMAXCONN) != 0) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "listen(2) failed:%s", strerror(errno));
        goto Fail;
    }
    nb->daemon_pid = fork();
    switch (nb->daemon_pid) {
    case -1:
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "fork(2) failed:%s", strerror(errno));
        goto Fail;
    case 0:
        close(pipe_fds[1]);
#ifdef __linux__
        prctl(PR_SET_DUMPABLE, 0, 0, 0, 0);
#endif
        daemon_vars.nb = nb;
        daemon_main(listen_fd, pipe_fds[0], tempdir);
        break;
    default:
        break;
    }
    close(listen_fd);
    listen_fd = -1;
    close(pipe_fds[0]);
    pipe_fds[0] = -1;

    /* setup engine */
    if ((nb->engine = ENGINE_new()) == NULL || !ENGINE_set_id(nb->engine, "neverbleed") ||
        !ENGINE_set_name(nb->engine, "privilege separation software engine") || !ENGINE_set_RSA(nb->engine, rsa_method)
#if OPENSSL_1_1_API
        || !ENGINE_set_EC(nb->engine, ecdsa_method)
#endif
            ) {
        snprintf(errbuf, NEVERBLEED_ERRBUF_SIZE, "failed to initialize the OpenSSL engine");
        goto Fail;
    }
    ENGINE_add(nb->engine);

    /* setup thread key */
    pthread_key_create(&nb->thread_key, dispose_thread_data);

    free(tempdir);
    return 0;
Fail:
    if (pipe_fds[0] != -1)
        close(pipe_fds[0]);
    if (pipe_fds[1] != -1)
        close(pipe_fds[1]);
    if (tempdir != NULL) {
        unlink_dir(tempdir);
        free(tempdir);
    }
    if (listen_fd != -1)
        close(listen_fd);
    if (nb->engine != NULL) {
        ENGINE_free(nb->engine);
        nb->engine = NULL;
    }
    return -1;
}